

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

PaError AlsaStart(PaAlsaStream *stream,int priming)

{
  snd_pcm_t *psVar1;
  int iVar2;
  int iVar3;
  PaError PVar4;
  undefined4 in_register_00000034;
  snd_pcm_uframes_t offset;
  snd_pcm_uframes_t frames;
  snd_pcm_channel_area_t *areas;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  psVar1 = (stream->playback).pcm;
  if (psVar1 == (snd_pcm_t *)0x0) {
    PVar4 = 0;
    goto LAB_00112ebd;
  }
  iVar3 = stream->callbackMode;
  iVar2 = snd_pcm_prepare(psVar1,CONCAT44(in_register_00000034,priming));
  if (iVar3 == 0) {
    PVar4 = 0;
    if (iVar2 < 0) {
      AlsaStart_cold_3();
LAB_00112f1c:
      PVar4 = -9999;
    }
  }
  else {
    PVar4 = 0;
    if (iVar2 < 0) {
      AlsaStart_cold_1();
      return -9999;
    }
    if ((stream->playback).canMmap != 0) {
      local_38 = snd_pcm_avail_update((stream->playback).pcm);
      snd_pcm_mmap_begin((stream->playback).pcm,&local_30,&local_40,&local_38);
      snd_pcm_areas_silence
                (local_30,local_40,(stream->playback).numHostChannels,local_38,
                 (stream->playback).nativeFormat);
      snd_pcm_mmap_commit((stream->playback).pcm,local_40,local_38);
    }
    if ((stream->playback).canMmap == 0) goto LAB_00112ebd;
    iVar2 = snd_pcm_start((stream->playback).pcm);
    if (iVar2 < 0) {
      AlsaStart_cold_2();
      goto LAB_00112f1c;
    }
  }
  if (iVar2 < 0) {
    return PVar4;
  }
LAB_00112ebd:
  if (((stream->capture).pcm != (snd_pcm_t *)0x0) && (stream->pcmsSynced == 0)) {
    iVar3 = snd_pcm_prepare();
    if (iVar3 < 0) {
      AlsaStart_cold_4();
      PVar4 = -9999;
    }
    else {
      iVar3 = snd_pcm_start((stream->capture).pcm);
      if (iVar3 < 0) {
        AlsaStart_cold_5();
        PVar4 = -9999;
      }
    }
  }
  return PVar4;
}

Assistant:

static PaError AlsaStart( PaAlsaStream *stream, int priming )
{
    PaError result = paNoError;

    if( stream->playback.pcm )
    {
        if( stream->callbackMode )
        {
            if( !priming )
            {
                /* Buffer isn't primed, so prepare and silence */
                ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
                if( stream->playback.canMmap )
                    SilenceBuffer( stream );
            }
            if( stream->playback.canMmap )
                ENSURE_( alsa_snd_pcm_start( stream->playback.pcm ), paUnanticipatedHostError );
        }
        else
            ENSURE_( alsa_snd_pcm_prepare( stream->playback.pcm ), paUnanticipatedHostError );
    }
    if( stream->capture.pcm && !stream->pcmsSynced )
    {
        ENSURE_( alsa_snd_pcm_prepare( stream->capture.pcm ), paUnanticipatedHostError );
        /* For a blocking stream we want to start capture as well, since nothing will happen otherwise */
        ENSURE_( alsa_snd_pcm_start( stream->capture.pcm ), paUnanticipatedHostError );
    }

end:
    return result;
error:
    goto end;
}